

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlCtxtNewInputFromFd(xmlParserCtxtPtr ctxt,char *url,int fd,char *encoding,int flags)

{
  xmlParserInputPtr input;
  int flags_local;
  char *encoding_local;
  int fd_local;
  char *url_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (fd < 0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    input._4_4_ = flags;
    if ((ctxt->options & 0x1000000U) != 0) {
      input._4_4_ = flags | 8;
    }
    ctxt_local = (xmlParserCtxtPtr)xmlNewInputFromFd(url,fd,input._4_4_);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (encoding != (char *)0x0) {
      xmlSwitchInputEncodingName(ctxt,(xmlParserInputPtr)ctxt_local,encoding);
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromFd(xmlParserCtxtPtr ctxt, const char *url,
                      int fd, const char *encoding, int flags) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (fd < 0))
	return(NULL);

    if (ctxt->options & XML_PARSE_UNZIP)
        flags |= XML_INPUT_UNZIP;

    input = xmlNewInputFromFd(url, fd, flags);
    if (input == NULL) {
	xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}